

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_peeling.cpp
# Opt level: O3

void __thiscall
spvtools::opt::LoopPeeling::FixExitCondition
          (LoopPeeling *this,
          function<unsigned_int_(spvtools::opt::Instruction_*)> *condition_builder)

{
  uint *puVar1;
  IRContext *pIVar2;
  CFG *this_00;
  Instruction *pIVar3;
  uint32_t *puVar4;
  pointer pOVar5;
  Loop *pLVar6;
  uint32_t uVar7;
  array<signed_char,_4UL> aVar8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar9;
  const_iterator cVar10;
  BasicBlock *this_01;
  Instruction *pIVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint32_t *puVar15;
  undefined1 local_60 [32];
  _Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false> local_40;
  _Any_data *local_38;
  
  pIVar2 = this->context_;
  local_38 = (_Any_data *)condition_builder;
  if ((pIVar2->valid_analyses_ & kAnalysisCFG) == kAnalysisNone) {
    IRContext::BuildCFG(pIVar2);
  }
  this_00 = (pIVar2->cfg_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::CFG,_std::default_delete<spvtools::opt::CFG>_>._M_t
            .super__Tuple_impl<0UL,_spvtools::opt::CFG_*,_std::default_delete<spvtools::opt::CFG>_>.
            super__Head_base<0UL,_spvtools::opt::CFG_*,_false>._M_head_impl;
  pIVar3 = (this->cloned_loop_->loop_merge_->label_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
           .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  uVar7 = 0;
  if (pIVar3->has_result_id_ == true) {
    uVar7 = Instruction::GetSingleWordOperand(pIVar3,(uint)pIVar3->has_type_id_);
  }
  pvVar9 = CFG::preds(this_00,uVar7);
  puVar15 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar4 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar15 != puVar4) {
    do {
      uVar7 = *puVar15;
      local_60._0_4_ = uVar7;
      cVar10 = std::
               _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
               ::find(&(this->cloned_loop_->loop_basic_blocks_)._M_h,(key_type_conflict *)local_60);
      if (cVar10.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
        if (uVar7 != 0) {
          this_01 = CFG::block(this_00,uVar7);
          pIVar3 = (this_01->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
          if ((pIVar3 == (Instruction *)0x0) ||
             ((pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false))
          {
            __assert_fail("!insts_.empty()",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/basic_block.h"
                          ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
          }
          pIVar3 = (this_01->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
                   super_IntrusiveNodeBase<spvtools::opt::Instruction>.previous_node_;
          if (pIVar3->opcode_ != OpBranchConditional) {
            __assert_fail("exit_condition->opcode() == spv::Op::OpBranchConditional",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                          ,0x146,
                          "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
                         );
          }
          pIVar11 = BasicBlock::GetMergeInst(this_01);
          local_60._0_8_ = pIVar3;
          if (pIVar11 != (Instruction *)0x0) {
            local_60._0_8_ =
                 (pIVar3->super_IntrusiveNodeBase<spvtools::opt::Instruction>).previous_node_;
          }
          if (*(long *)(local_38 + 1) != 0) {
            local_60._16_4_ =
                 (**(code **)(local_38->_M_pod_data + 0x18))(local_38,(Instruction **)local_60);
            local_60._0_8_ = &PTR__SmallVector_003d7c78;
            puVar1 = (uint *)(local_60 + 0x10);
            local_40._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_60._8_8_ = 1;
            uVar12 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
            if (pIVar3->has_type_id_ == false) {
              uVar12 = (ulong)pIVar3->has_result_id_;
            }
            pOVar5 = (pIVar3->operands_).
                     super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            uVar13 = ((long)(pIVar3->operands_).
                            super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                     -0x5555555555555555;
            if (uVar12 <= uVar13 && uVar13 - uVar12 != 0) {
              local_60._24_8_ = puVar1;
              utils::SmallVector<unsigned_int,_2UL>::operator=
                        ((SmallVector<unsigned_int,_2UL> *)
                         ((long)((pOVar5->words).buffer + 0xfffffffffffffffc) +
                         (ulong)(uint)((int)uVar12 * 0x30)),
                         (SmallVector<unsigned_int,_2UL> *)local_60);
              local_60._0_8_ = &PTR__SmallVector_003d7c78;
              if (local_40._M_head_impl !=
                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                            *)&local_40,local_40._M_head_impl);
              }
              pLVar6 = this->cloned_loop_;
              uVar14 = (pIVar3->has_result_id_ & 1) + 1;
              if (pIVar3->has_type_id_ == false) {
                uVar14 = (uint)pIVar3->has_result_id_;
              }
              uVar7 = Instruction::GetSingleWordOperand(pIVar3,uVar14 + 1);
              local_60._0_4_ = uVar7;
              cVar10 = std::
                       _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                       ::find(&(pLVar6->loop_basic_blocks_)._M_h,(key_type_conflict *)local_60);
              uVar14 = (pIVar3->has_result_id_ & 1) + 1;
              if (pIVar3->has_type_id_ == false) {
                uVar14 = (uint)pIVar3->has_result_id_;
              }
              local_60._16_4_ =
                   Instruction::GetSingleWordOperand
                             (pIVar3,uVar14 + 1 +
                                     (uint)(cVar10.super__Node_iterator_base<unsigned_int,_false>.
                                            _M_cur == (__node_type *)0x0));
              local_60._0_8_ = &PTR__SmallVector_003d7c78;
              local_40._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
              local_60._8_8_ = 1;
              uVar12 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
              if (pIVar3->has_type_id_ == false) {
                uVar12 = (ulong)pIVar3->has_result_id_;
              }
              uVar12 = uVar12 + 1;
              pOVar5 = (pIVar3->operands_).
                       super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar13 = ((long)(pIVar3->operands_).
                              super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                       -0x5555555555555555;
              if (uVar12 <= uVar13 && uVar13 - uVar12 != 0) {
                local_60._24_8_ = puVar1;
                utils::SmallVector<unsigned_int,_2UL>::operator=
                          ((SmallVector<unsigned_int,_2UL> *)
                           ((long)((pOVar5->words).buffer + 0xfffffffffffffffc) +
                           (ulong)(uint)((int)uVar12 * 0x30)),
                           (SmallVector<unsigned_int,_2UL> *)local_60);
                local_60._0_8_ = &PTR__SmallVector_003d7c78;
                if (local_40._M_head_impl !=
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                  std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                  operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                              *)&local_40,local_40._M_head_impl);
                }
                pIVar11 = (this->cloned_loop_->loop_merge_->label_)._M_t.
                          super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
                aVar8._M_elems[0] = '\0';
                aVar8._M_elems[1] = '\0';
                aVar8._M_elems[2] = '\0';
                aVar8._M_elems[3] = '\0';
                if (pIVar11->has_result_id_ == true) {
                  aVar8._M_elems =
                       (_Type)Instruction::GetSingleWordOperand(pIVar11,(uint)pIVar11->has_type_id_)
                  ;
                }
                local_60._0_8_ = &PTR__SmallVector_003d7c78;
                local_40._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
                local_60._8_8_ = 1;
                uVar12 = (ulong)(pIVar3->has_result_id_ & 1) + 1;
                if (pIVar3->has_type_id_ == false) {
                  uVar12 = (ulong)pIVar3->has_result_id_;
                }
                uVar12 = uVar12 + 2;
                pOVar5 = (pIVar3->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start;
                uVar13 = ((long)(pIVar3->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar5 >> 4) *
                         -0x5555555555555555;
                local_60._16_4_ = aVar8._M_elems;
                if (uVar12 <= uVar13 && uVar13 - uVar12 != 0) {
                  local_60._24_8_ = puVar1;
                  utils::SmallVector<unsigned_int,_2UL>::operator=
                            ((SmallVector<unsigned_int,_2UL> *)
                             ((long)((pOVar5->words).buffer + 0xfffffffffffffffc) +
                             (ulong)(uint)((int)uVar12 * 0x30)),
                             (SmallVector<unsigned_int,_2UL> *)local_60);
                  local_60._0_8_ = &PTR__SmallVector_003d7c78;
                  if (local_40._M_head_impl !=
                      (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0) {
                    std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
                    operator()((default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                *)&local_40,local_40._M_head_impl);
                  }
                  pIVar2 = this->context_;
                  if ((pIVar2->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
                    IRContext::BuildDefUseManager(pIVar2);
                  }
                  analysis::DefUseManager::AnalyzeInstUse
                            ((pIVar2->def_use_mgr_)._M_t.
                             super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
                             .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>
                             ._M_head_impl,pIVar3);
                  return;
                }
              }
            }
            local_40._M_head_impl = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0;
            local_60._8_8_ = 1;
            local_60._0_8_ = &PTR__SmallVector_003d7c78;
            local_60._24_8_ = puVar1;
            __assert_fail("index < operands_.size() && \"operand index out of bound\"",
                          "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/instruction.h"
                          ,0x2b8,
                          "void spvtools::opt::Instruction::SetOperand(uint32_t, Operand::OperandData &&)"
                         );
          }
          std::__throw_bad_function_call();
        }
        break;
      }
      puVar15 = puVar15 + 1;
    } while (puVar15 != puVar4);
  }
  __assert_fail("condition_block_id != 0 && \"2nd loop in improperly connected\"",
                "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/loop_peeling.cpp"
                ,0x142,
                "void spvtools::opt::LoopPeeling::FixExitCondition(const std::function<uint32_t (Instruction *)> &)"
               );
}

Assistant:

void LoopPeeling::FixExitCondition(
    const std::function<uint32_t(Instruction*)>& condition_builder) {
  CFG& cfg = *context_->cfg();

  uint32_t condition_block_id = 0;
  for (uint32_t id : cfg.preds(GetClonedLoop()->GetMergeBlock()->id())) {
    if (GetClonedLoop()->IsInsideLoop(id)) {
      condition_block_id = id;
      break;
    }
  }
  assert(condition_block_id != 0 && "2nd loop in improperly connected");

  BasicBlock* condition_block = cfg.block(condition_block_id);
  Instruction* exit_condition = condition_block->terminator();
  assert(exit_condition->opcode() == spv::Op::OpBranchConditional);
  BasicBlock::iterator insert_point = condition_block->tail();
  if (condition_block->GetMergeInst()) {
    --insert_point;
  }

  exit_condition->SetInOperand(0, {condition_builder(&*insert_point)});

  uint32_t to_continue_block_idx =
      GetClonedLoop()->IsInsideLoop(exit_condition->GetSingleWordInOperand(1))
          ? 1
          : 2;
  exit_condition->SetInOperand(
      1, {exit_condition->GetSingleWordInOperand(to_continue_block_idx)});
  exit_condition->SetInOperand(2, {GetClonedLoop()->GetMergeBlock()->id()});

  // Update def/use manager.
  context_->get_def_use_mgr()->AnalyzeInstUse(exit_condition);
}